

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::LocalInvocationIDCase::~LocalInvocationIDCase(LocalInvocationIDCase *this)

{
  ComputeBuiltinVarCase::~ComputeBuiltinVarCase(&this->super_ComputeBuiltinVarCase);
  operator_delete(this,0xf0);
  return;
}

Assistant:

LocalInvocationIDCase (Context& context)
		: ComputeBuiltinVarCase(context, "local_invocation_id", "gl_LocalInvocationID", TYPE_UINT_VEC3)
	{
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,1), UVec3(2,7,3)));
		m_subCases.push_back(SubCase(UVec3(2,1,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(2,1,1), UVec3(1,3,5)));
		m_subCases.push_back(SubCase(UVec3(1,3,1), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,7), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(1,1,7), UVec3(3,3,1)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(1,1,1)));
		m_subCases.push_back(SubCase(UVec3(10,3,4), UVec3(3,1,2)));
	}